

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.cpp
# Opt level: O3

void __thiscall
cppurses::detail::Timer_event_loop::register_widget(Timer_event_loop *this,Widget *w)

{
  int *piVar1;
  int iVar2;
  undefined1 local_70 [24];
  vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_> local_58;
  Timer_event_loop *local_40;
  _Elt_pointer local_38;
  _Elt_pointer local_30;
  code *local_28;
  
  local_70._16_8_ = w;
  std::
  _Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
  ::_M_emplace_unique<cppurses::Widget*>
            ((_Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
              *)&this->registered_widgets_,(Widget **)(local_70 + 0x10));
  local_58.super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._16_8_ = &PTR__Slot_00163628;
  local_38 = (_Elt_pointer)0x0;
  local_28 = std::
             _Function_handler<void_(cppurses::Widget_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/timer_event_loop.cpp:22:25)>
             ::_M_invoke;
  local_30 = (_Elt_pointer)
             std::
             _Function_handler<void_(cppurses::Widget_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/timer_event_loop.cpp:22:25)>
             ::_M_manager;
  local_40 = this;
  sig::
  Signal_impl<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>
  ::connect((Signal_impl<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>
             *)local_70,
            (int)(w->destroyed).pimpl_.
                 super___shared_ptr<sig::Signal_impl<void_(cppurses::Widget_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(cppurses::Widget_&)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(sockaddr *)(local_70 + 0x10),1);
  if ((_Map_pointer)local_70._8_8_ != (_Map_pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)(local_70._8_8_ + 0xc);
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = *(int *)(local_70._8_8_ + 0xc);
      *(int *)(local_70._8_8_ + 0xc) = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(code *)(*(shared_ptr<sig::Connection_impl<void_(cppurses::Widget_&)>_> **)local_70._8_8_)
                [1].
                super___shared_ptr<sig::Connection_impl<void_(cppurses::Widget_&)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)();
    }
  }
  local_70._16_8_ = &PTR__Slot_00163628;
  if (local_30 != (_Elt_pointer)0x0) {
    (*(code *)local_30)(&local_40,&local_40,3);
  }
  local_70._16_8_ = &PTR__Slot_base_001632e0;
  std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>::~vector(&local_58);
  return;
}

Assistant:

void Timer_event_loop::register_widget(Widget& w)
{
    registered_widgets_.emplace(&w);
    w.destroyed.connect([this](Widget& d) { registered_widgets_.erase(&d); });
}